

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tztrans.cpp
# Opt level: O2

UBool __thiscall
icu_63::TimeZoneTransition::operator==(TimeZoneTransition *this,TimeZoneTransition *that)

{
  TimeZoneRule *pTVar1;
  bool bVar2;
  int iVar3;
  UBool UVar4;
  
  UVar4 = '\x01';
  if (this != that) {
    bVar2 = std::type_info::operator!=
                      ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                       (type_info *)(that->super_UObject)._vptr_UObject[-1]);
    if (!bVar2) {
      if ((this->fTime == that->fTime) && (!NAN(this->fTime) && !NAN(that->fTime))) {
        pTVar1 = this->fFrom;
        if ((pTVar1 == (TimeZoneRule *)0x0 && that->fFrom == (TimeZoneRule *)0x0) ||
           ((pTVar1 != (TimeZoneRule *)0x0 && that->fFrom != (TimeZoneRule *)0x0 &&
            (iVar3 = (*(pTVar1->super_UObject)._vptr_UObject[4])(), (char)iVar3 != '\0')))) {
          pTVar1 = this->fTo;
          if (pTVar1 == (TimeZoneRule *)0x0 && that->fTo == (TimeZoneRule *)0x0) {
            return '\x01';
          }
          if ((pTVar1 != (TimeZoneRule *)0x0 && that->fTo != (TimeZoneRule *)0x0) &&
             (iVar3 = (*(pTVar1->super_UObject)._vptr_UObject[4])(), (char)iVar3 != '\0')) {
            return '\x01';
          }
        }
      }
    }
    UVar4 = '\0';
  }
  return UVar4;
}

Assistant:

UBool
TimeZoneTransition::operator==(const TimeZoneTransition& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }
    if (fTime != that.fTime) {
        return FALSE;
    }
    if ((fFrom == NULL && that.fFrom == NULL)
        || (fFrom != NULL && that.fFrom != NULL && *fFrom == *(that.fFrom))) {
        if ((fTo == NULL && that.fTo == NULL)
            || (fTo != NULL && that.fTo != NULL && *fTo == *(that.fTo))) {
            return TRUE;
        }
    }
    return FALSE;
}